

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O1

ON__UINT64 __thiscall
ON_SerialNumberMap::GetElements
          (ON_SerialNumberMap *this,ON__UINT64 sn0,ON__UINT64 sn1,ON__UINT64 max_count,
          ON_SimpleArray<ON_SerialNumberMap::SN_ELEMENT> *elements)

{
  ON_SerialNumberMapPrivate *pOVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  SN_ELEMENT *pSVar9;
  ON_SN_BLOCK *pOVar10;
  ON__UINT64 *pOVar11;
  uint uVar12;
  long lVar14;
  SN_ELEMENT *x;
  ulong local_68;
  ulong local_58;
  ulong uVar13;
  
  if (max_count != 0 && sn0 <= sn1) {
    if (this->m_sn_purged < this->m_sn_count) {
      lVar14 = (long)*(int *)(elements + 0x10);
      if (sn0 + 3 <= sn1) {
        if (*(uint *)(elements + 0x14) < (uint)(lVar14 + 3U)) {
          ON_SimpleArray<ON_SerialNumberMap::SN_ELEMENT>::SetCapacity(elements,lVar14 + 3U);
        }
        if (sn0 <= sn1) {
          do {
            pSVar9 = FindElementHelper(this,sn0);
            if ((pSVar9 != (SN_ELEMENT *)0x0) && (pSVar9->m_sn_active != '\0')) {
              ON_SimpleArray<ON_SerialNumberMap::SN_ELEMENT>::Append(elements,pSVar9);
            }
            sn0 = sn0 + 1;
          } while (sn0 <= sn1);
        }
        return *(int *)(elements + 0x10) - lVar14;
      }
      uVar5 = this->m_snblk_list_count;
      if (uVar5 != 0) {
        local_68 = 0;
        uVar6 = 0;
LAB_004d5962:
        uVar7 = uVar6;
        pOVar10 = this->m_snblk_list[uVar7];
        if (pOVar10->m_sn1 < sn0) goto code_r0x004d596c;
        local_68 = 0;
        if (pOVar10->m_sn0 <= sn1) {
          pSVar9 = (SN_ELEMENT *)0x0;
          do {
            local_68 = (ulong)pOVar10->m_count;
            pOVar11 = &pOVar10->m_sn[1].m_sn;
            while( true ) {
              if ((sn0 <= pOVar11[-7]) && ((char)pOVar11[-6] != '\0')) {
                pSVar9 = (SN_ELEMENT *)(pOVar11 + -9);
                goto LAB_004d5a4d;
              }
              if (local_68 == 1) break;
              local_68 = local_68 - 1;
              uVar6 = *pOVar11;
              pOVar11 = pOVar11 + 7;
              if (sn1 < uVar6) goto LAB_004d5a4d;
            }
            uVar7 = uVar7 + 1;
          } while ((uVar7 < uVar5) && (pOVar10 = this->m_snblk_list[uVar7], pOVar10->m_sn0 <= sn1));
          local_68 = 0;
LAB_004d5a4d:
          if (pSVar9 == (SN_ELEMENT *)0x0) goto LAB_004d5a5f;
          x = (SN_ELEMENT *)0x0;
          if (pSVar9->m_sn <= sn1) {
            x = pSVar9;
          }
          goto LAB_004d5a62;
        }
        goto LAB_004d5a5f;
      }
      local_68 = 0;
      uVar7 = 0;
LAB_004d5a5f:
      x = (SN_ELEMENT *)0x0;
LAB_004d5a62:
      if (x == (SN_ELEMENT *)0x0) {
        uVar6 = 0;
      }
      else {
        pOVar10 = this->m_snblk_list[uVar7];
        uVar4 = x->m_sn;
        uVar12 = pOVar10->m_count - pOVar10->m_purged;
        uVar13 = (ulong)uVar12;
        if (uVar12 == 0) {
          uVar6 = 0;
        }
        else {
          uVar6 = pOVar10->m_sn0;
          if (pOVar10->m_sn0 <= uVar4) {
            uVar6 = uVar4;
          }
          uVar8 = pOVar10->m_sn1;
          if (sn1 <= pOVar10->m_sn1) {
            uVar8 = sn1;
          }
          uVar6 = (uVar8 - uVar6) + 1;
          if (uVar13 <= uVar6) {
            uVar6 = uVar13;
          }
        }
        uVar8 = uVar7 + 1;
        if (uVar8 < uVar5) {
          do {
            if (sn1 < this->m_snblk_list[uVar8]->m_sn0) break;
            if (pOVar10->m_count == pOVar10->m_purged) {
              uVar3 = 0;
            }
            else {
              uVar3 = pOVar10->m_sn0;
              if (pOVar10->m_sn0 <= uVar4) {
                uVar3 = uVar4;
              }
              uVar2 = pOVar10->m_sn1;
              if (sn1 <= pOVar10->m_sn1) {
                uVar2 = sn1;
              }
              uVar3 = (uVar2 - uVar3) + 1;
              if (uVar13 <= uVar3) {
                uVar3 = uVar13;
              }
            }
            uVar6 = uVar6 + uVar3;
            uVar8 = uVar8 + 1;
          } while (uVar5 != uVar8);
        }
      }
      pOVar10 = this->m_sn_block0;
      uVar5 = (ulong)pOVar10->m_purged;
      local_58 = 0;
      pSVar9 = (SN_ELEMENT *)0x0;
      if (pOVar10->m_purged < pOVar10->m_count) {
        local_58 = 0;
        pSVar9 = (SN_ELEMENT *)0x0;
        if (pOVar10->m_sn0 <= sn1) {
          local_58 = 0;
          pSVar9 = (SN_ELEMENT *)0x0;
          if (sn0 <= pOVar10->m_sn1) {
            local_58 = 0;
            pSVar9 = (SN_ELEMENT *)0x0;
            if (pOVar10->m_sorted == 0) {
              if (uVar5 != 0) {
                if (this->m_bHashTableIsValid != '\0') {
                  this->m_bHashTableIsValid = '\0';
                }
                this->m_sn_count = this->m_sn_count - uVar5;
                this->m_sn_purged = this->m_sn_purged - uVar5;
                ON_SN_BLOCK::CullBlockHelper(pOVar10);
                if (this->m_snblk_list_count == 0) {
                  uVar5 = 0;
                }
                else {
                  uVar5 = this->m_snblk_list[this->m_snblk_list_count - 1]->m_sn1;
                }
                uVar4 = this->m_sn_block0->m_sn1;
                if (uVar4 < uVar5) {
                  uVar4 = uVar5;
                }
                pOVar1 = this->m_private;
                pOVar1->m_maxsn = uVar4;
                if (uVar4 < 0xffffffff) {
                  pOVar1->m_lower_maxsn = uVar4;
                }
              }
              if (this->m_sn_block0->m_count == 0) {
                local_58 = 0;
                pSVar9 = (SN_ELEMENT *)0x0;
              }
              else {
                if (this->m_bHashTableIsValid != '\0') {
                  this->m_bHashTableIsValid = '\0';
                }
                ON_SN_BLOCK::SortBlockHelper(this->m_sn_block0);
                pOVar10 = this->m_sn_block0;
                local_58 = 0;
                pSVar9 = (SN_ELEMENT *)0x0;
                if (pOVar10->m_sn0 <= sn1) {
                  local_58 = 0;
                  pSVar9 = (SN_ELEMENT *)0x0;
                  if (sn0 <= pOVar10->m_sn1) {
                    local_58 = (ulong)pOVar10->m_count;
                    pSVar9 = pOVar10->m_sn;
                  }
                }
              }
            }
          }
        }
      }
      if (pSVar9 != (SN_ELEMENT *)0x0) {
        pOVar10 = this->m_sn_block0;
        uVar12 = pOVar10->m_count - pOVar10->m_purged;
        if (uVar12 == 0) {
          uVar5 = 0;
        }
        else {
          uVar5 = pSVar9->m_sn;
          if (pSVar9->m_sn < pOVar10->m_sn0) {
            uVar5 = pOVar10->m_sn0;
          }
          uVar4 = pOVar10->m_sn1;
          if (sn1 <= pOVar10->m_sn1) {
            uVar4 = sn1;
          }
          uVar5 = (uVar4 - uVar5) + 1;
          if (uVar12 <= uVar5) {
            uVar5 = (ulong)uVar12;
          }
        }
        uVar6 = uVar6 + uVar5;
      }
      uVar5 = (sn1 - sn0) + 1;
      if (uVar6 < uVar5) {
        uVar5 = uVar6;
      }
      if (0x1fff < uVar5) {
        uVar5 = 0x2000;
      }
      if (*(uint *)(elements + 0x14) < (uint)((long)*(int *)(elements + 0x10) + uVar5)) {
        ON_SimpleArray<ON_SerialNumberMap::SN_ELEMENT>::SetCapacity
                  (elements,(long)*(int *)(elements + 0x10) + uVar5);
      }
      do {
        while( true ) {
          while( true ) {
            if (pSVar9 == (SN_ELEMENT *)0x0 && x == (SN_ELEMENT *)0x0) {
              return *(int *)(elements + 0x10) - lVar14;
            }
            if ((pSVar9 == (SN_ELEMENT *)0x0) ||
               ((x != (SN_ELEMENT *)0x0 && (x->m_sn <= pSVar9->m_sn)))) break;
            if (pSVar9->m_sn_active != '\0') {
              ON_SimpleArray<ON_SerialNumberMap::SN_ELEMENT>::Append(elements,pSVar9);
            }
            local_58 = local_58 - 1;
            if (local_58 == 0) {
              local_58 = 0;
              pSVar9 = (SN_ELEMENT *)0x0;
            }
            else if (sn1 < pSVar9[1].m_sn) {
              pSVar9 = (SN_ELEMENT *)0x0;
            }
            else {
              pSVar9 = pSVar9 + 1;
            }
          }
          if (x->m_sn_active != '\0') {
            ON_SimpleArray<ON_SerialNumberMap::SN_ELEMENT>::Append(elements,x);
          }
          local_68 = local_68 - 1;
          if (local_68 == 0) break;
          uVar5 = uVar7;
          if (sn1 < x[1].m_sn) {
LAB_004d5c6a:
            x = (SN_ELEMENT *)0x0;
            uVar7 = uVar5;
          }
          else {
            x = x + 1;
          }
        }
        uVar5 = uVar7 + 1;
        if ((this->m_snblk_list_count <= uVar5) ||
           (pOVar10 = this->m_snblk_list[uVar7 + 1], pOVar10->m_sn0 < sn1)) {
          local_68 = 0;
          goto LAB_004d5c6a;
        }
        local_68 = (ulong)pOVar10->m_count;
        x = pOVar10->m_sn;
        uVar7 = uVar5;
      } while( true );
    }
  }
  return 0;
code_r0x004d596c:
  uVar6 = uVar7 + 1;
  uVar7 = uVar5;
  if (uVar5 == uVar6) goto LAB_004d5a5f;
  goto LAB_004d5962;
}

Assistant:

ON__UINT64 ON_SerialNumberMap::GetElements(
  ON__UINT64 sn0,
  ON__UINT64 sn1, 
  ON__UINT64 max_count,
  ON_SimpleArray<SN_ELEMENT>& elements
  ) const
{
  ON__UINT64 i,j,k,c;
  const SN_ELEMENT *ei, *ek;

  const int elements_count0 = elements.Count();

  if ( sn1 < sn0 || max_count <= 0 || m_sn_count <= m_sn_purged )
    return 0;

  if ( sn0+3 <= sn1 )
  {
    elements.Reserve(elements_count0+3);
    while ( sn0 <= sn1 )
    {
      ei = const_cast<ON_SerialNumberMap*>(this)->FindElementHelper(sn0++);
      if ( ei && ei->m_sn_active )
        elements.Append(*ei);
    }
    return (elements.Count() - elements_count0); 
  }

  ek = 0;
  k = 0;
  for ( j = 0; j < m_snblk_list_count; j++ )
  {
    if ( m_snblk_list[j]->m_sn1 < sn0 )
      continue;
    if ( sn1 < m_snblk_list[j]->m_sn0 )
      break;

    k = m_snblk_list[j]->m_count; // always > 0
    ek = &m_snblk_list[j]->m_sn[0];
    while ( ek->m_sn < sn0 || !ek->m_sn_active )
    {
      if ( --k )
      {
        if ((++ek)->m_sn > sn1)
        {
          ek = 0;
          break;
        }
      }
      else if ( ++j < m_snblk_list_count && m_snblk_list[j]->m_sn0 <= sn1 )
      {
        k = m_snblk_list[j]->m_count; // always > 0
        ek = &m_snblk_list[j]->m_sn[0];
      }
      else
      {
        ek = 0;
        break;
      }
    }
    if ( ek && ek->m_sn > sn1 )
      ek = 0;
    break;
  }

  // set c = estimate of number of items in m_snblk_list[]
  if ( ek )
  {
    c = m_snblk_list[j]->ActiveElementEstimate(ek->m_sn,sn1);
    for ( i = j+1; i < m_snblk_list_count && m_snblk_list[i]->m_sn0 <= sn1; i++ )
    {
      c += m_snblk_list[j]->ActiveElementEstimate(ek->m_sn,sn1);
    }
  }
  else
    c = 0;

  // determine where to begin searching in m_sn_block0
  i = 0;
  ei = 0;
  if (    m_sn_block0.m_count > m_sn_block0.m_purged
       && sn1 >= m_sn_block0.m_sn0
       && sn0 <= m_sn_block0.m_sn1
       && !m_sn_block0.m_sorted
     )
  {
    if ( !m_sn_block0.m_sorted )
    {
      if ( m_sn_block0.m_purged > 0 )
      {
        // memory location for specific elements will be changed.
        // This will make the hash table invalid.
        const_cast<ON_SerialNumberMap*>(this)->Internal_HashTableInvalidate();
        const_cast<ON_SerialNumberMap*>(this)->m_sn_count -= m_sn_block0.m_purged;
        const_cast<ON_SerialNumberMap*>(this)->m_sn_purged -= m_sn_block0.m_purged;
        const_cast<ON_SerialNumberMap*>(this)->m_sn_block0.CullBlockHelper();
        const_cast<ON_SerialNumberMap*>(this)->UpdateMaxSNHelper();
      }
      if ( m_sn_block0.m_count > 0 )
      {
        // memory location for specific elements will be changed.
        // This will make the hash table invalid.
        const_cast<ON_SerialNumberMap*>(this)->Internal_HashTableInvalidate();
        const_cast<ON_SerialNumberMap*>(this)->m_sn_block0.SortBlockHelper();
        if ( sn1 >= m_sn_block0.m_sn0 && sn0 <= m_sn_block0.m_sn1 )
        {
          i = m_sn_block0.m_count;
          ei = &m_sn_block0.m_sn[0];
        }
      }
    }
    else
    {
      i = m_sn_block0.m_count;
      ei = &m_sn_block0.m_sn[0];
      while ( ei->m_sn < sn0 || !ei->m_sn_active )
      {
        if ( --i )
          ei++;
        else
        {
          ei = 0;
          break;
        }
      }
      if ( ei && ei->m_sn > sn1 )
      {
        ei = 0;
      }
    }
  }

  // adjust c = estimate of number of items in m_snblk_list[]
  if ( ei )
    c += m_sn_block0.ActiveElementEstimate(ei->m_sn,sn1);
  if (c > (sn1-sn0+1) )
    c = (sn1-sn0+1);
  if ( c > 2*4096 )
    c = 2*4096;

  // reserve room for elements so we don't thrash memory
  // while growing a large dynamic array.
  elements.Reserve(elements.Count()+((int)c));

  // Add appropriate elements to elements[] array.
  while (ei || ek)
  {
    if (ei && (!ek || ei->m_sn < ek->m_sn) )
    {
      if ( ei->m_sn_active )
        elements.Append(*ei);
      if ( --i )
      {
        if ( (++ei)->m_sn > sn1 )
        {
          ei = 0;
        }
      }
      else
      {
        ei = 0;
      }
    }
    else 
    {
      if ( ek->m_sn_active )
        elements.Append(*ek);
      if ( --k )
      {
        if ( (++ek)->m_sn > sn1 )
        {
          ek = 0;
        }
      }
      else if (++j < m_snblk_list_count && sn1 <= m_snblk_list[j]->m_sn0 )
      {
        k = m_snblk_list[j]->m_count; // always > 0
        ek = &m_snblk_list[j]->m_sn[0];
      }
      else 
      {
        ek = 0;
      }
    }
  }
  
  return (elements.Count() - elements_count0);
}